

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

shared_ptr<const_std::out_of_range>
chaiscript::detail::Cast_Helper_Inner<std::shared_ptr<const_std::out_of_range>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Type_Info *this;
  Any *pAVar2;
  shared_ptr<const_std::out_of_range> *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_std::out_of_range> sVar5;
  Type_Conversions_State *param_1_local;
  Boxed_Value *ob_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  this = Boxed_Value::get_type_info((Boxed_Value *)param_2);
  bVar1 = Type_Info::is_const(this);
  if (bVar1) {
    pAVar2 = Boxed_Value::get((Boxed_Value *)param_2);
    psVar3 = Any::cast<std::shared_ptr<std::out_of_range_const>>(pAVar2);
    std::shared_ptr<const_std::out_of_range>::shared_ptr
              ((shared_ptr<const_std::out_of_range> *)ob,psVar3);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    pAVar2 = Boxed_Value::get((Boxed_Value *)param_2);
    Any::cast<std::shared_ptr<std::out_of_range>>(pAVar2);
    sVar5 = std::const_pointer_cast<std::out_of_range_const,std::out_of_range>
                      ((shared_ptr<std::out_of_range> *)ob);
    _Var4 = sVar5.super___shared_ptr<const_std::out_of_range,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar5.super___shared_ptr<const_std::out_of_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<const_std::out_of_range,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ob;
  return (shared_ptr<const_std::out_of_range>)
         sVar5.super___shared_ptr<const_std::out_of_range,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto cast(const Boxed_Value &ob, const Type_Conversions_State *) {
        if (!ob.get_type_info().is_const()) {
          return std::const_pointer_cast<const Result>(ob.get().cast<std::shared_ptr<Result>>());
        } else {
          return ob.get().cast<std::shared_ptr<const Result>>();
        }
      }